

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRoundedRectangleProfileDef::~IfcRoundedRectangleProfileDef
          (IfcRoundedRectangleProfileDef *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  bool *pbVar3;
  
  this[-1].super_IfcRectangleProfileDef.super_IfcParameterizedProfileDef.super_IfcProfileDef.
  ProfileName.ptr._M_dataplus._M_p = (pointer)0x84e708;
  *(undefined8 *)
   &(this->super_IfcRectangleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x18 = 0x84e730;
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcRectangleProfileDef.super_IfcParameterizedProfileDef.
             super_IfcProfileDef.field_0x60;
  puVar2 = &this[-1].super_IfcRectangleProfileDef.super_IfcParameterizedProfileDef.field_0x70;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  puVar2 = (undefined1 *)
           this[-1].super_IfcRectangleProfileDef.super_IfcParameterizedProfileDef.
           super_IfcProfileDef.ProfileName.ptr.field_2._M_allocated_capacity;
  pbVar3 = &this[-1].super_IfcRectangleProfileDef.super_IfcParameterizedProfileDef.
            super_IfcProfileDef.ProfileName.have;
  if ((bool *)puVar2 != pbVar3) {
    operator_delete(puVar2,*(long *)pbVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcRectangleProfileDef.super_IfcParameterizedProfileDef.
                   super_IfcProfileDef.ProfileName,0xc0);
  return;
}

Assistant:

IfcRoundedRectangleProfileDef() : Object("IfcRoundedRectangleProfileDef") {}